

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mi.h
# Opt level: O3

MI<136UL,_GF2::MOGrevlex<136UL>_> * __thiscall
GF2::MI<136UL,_GF2::MOGrevlex<136UL>_>::SelfReduce(MI<136UL,_GF2::MOGrevlex<136UL>_> *this)

{
  byte bVar1;
  bool bVar2;
  byte bVar3;
  _List_node_base *p_Var4;
  iterator pos;
  
  if ((this->
      super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
      ).
      super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)this) {
    bVar1 = 0;
    p_Var4 = (_List_node_base *)this;
    do {
      pos._M_node = p_Var4->_M_prev;
      bVar2 = Reduce(this,pos);
      if (bVar2) {
        Env::Trace("SelfReduce: %zu polys (%zu mons)",
                   (this->
                   super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                   ).
                   super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                   ._M_impl._M_node._M_size,pos._M_node[2]._M_next);
        p_Var4 = (pos._M_node)->_M_next;
        if (pos._M_node[2]._M_next == (_List_node_base *)0x0) {
          std::__cxx11::
          list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
          ::_M_erase(&this->
                      super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
                     ,pos);
        }
        else {
          Move(this,pos);
        }
        bVar1 = 1;
        pos._M_node = p_Var4;
      }
      p_Var4 = pos._M_node;
    } while ((pos._M_node !=
              (this->
              super_list<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
              ).
              super__List_base<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>,_std::allocator<GF2::MP<136UL,_GF2::MOGrevlex<136UL>_>_>_>
              ._M_impl._M_node.super__List_node_base._M_next) ||
            (bVar3 = ~bVar1, bVar1 = 0, p_Var4 = (_List_node_base *)this,
            !(bool)(bVar3 & 1 | pos._M_node == (_List_node_base *)this)));
  }
  return this;
}

Assistant:

MI& SelfReduce()
	{	
		// важно, чтобы система была нормализована
		assert(IsNormalized());
		// цикл замены на нормальные формы
		bool changed;
		do
		{
			changed = false;
			// двигаемся от старших многочленов к младшим
			for (iterator pos = end(); pos != begin();)
				// есть изменения?
				if (Reduce(--pos))
				{
					changed = true;
					Env::Trace("SelfReduce: %zu polys (%zu mons)", 
						Size(), pos->Size());
					// нулевая форма? исключаем
					if (*pos == 0)
						pos = RemoveAt(pos);
					// ненулевая? перемещаем
					else
						Move(pos++);
				}
		}
		while (changed);
		return *this;
	}